

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall VmaBlockVector::CheckCorruption(VmaBlockVector *this)

{
  bool bVar1;
  VmaAllocator pVVar2;
  VmaAllocator hAllocator;
  VmaBlockVector *in_RDI;
  VkResult res;
  VmaDeviceMemoryBlock *pBlock;
  uint32_t blockIndex;
  VmaMutexLockRead lock;
  VmaMutexLockRead *in_stack_ffffffffffffffa0;
  VmaRWMutex *in_stack_ffffffffffffffa8;
  VmaMutexLockRead *in_stack_ffffffffffffffb0;
  uint local_1c;
  VkResult local_4;
  
  bVar1 = IsCorruptionDetectionEnabled(in_RDI);
  if (bVar1) {
    VmaMutexLockRead::VmaMutexLockRead
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
    local_1c = 0;
    while( true ) {
      pVVar2 = (VmaAllocator)(ulong)local_1c;
      hAllocator = (VmaAllocator)
                   VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::size
                             (&in_RDI->m_Blocks);
      if (hAllocator <= pVVar2) break;
      in_stack_ffffffffffffffa0 =
           (VmaMutexLockRead *)
           VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::operator[]
                     (&in_RDI->m_Blocks,(ulong)local_1c);
      local_4 = VmaDeviceMemoryBlock::CheckCorruption((VmaDeviceMemoryBlock *)in_RDI,hAllocator);
      if (local_4 != VK_SUCCESS) goto LAB_002f8105;
      local_1c = local_1c + 1;
    }
    local_4 = VK_SUCCESS;
LAB_002f8105:
    VmaMutexLockRead::~VmaMutexLockRead(in_stack_ffffffffffffffa0);
  }
  else {
    local_4 = VK_ERROR_FEATURE_NOT_PRESENT;
  }
  return local_4;
}

Assistant:

VkResult VmaBlockVector::CheckCorruption()
{
    if (!IsCorruptionDetectionEnabled())
    {
        return VK_ERROR_FEATURE_NOT_PRESENT;
    }

    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);
    for (uint32_t blockIndex = 0; blockIndex < m_Blocks.size(); ++blockIndex)
    {
        VmaDeviceMemoryBlock* const pBlock = m_Blocks[blockIndex];
        VMA_ASSERT(pBlock);
        VkResult res = pBlock->CheckCorruption(m_hAllocator);
        if (res != VK_SUCCESS)
        {
            return res;
        }
    }
    return VK_SUCCESS;
}